

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_transaction.cpp
# Opt level: O2

string * __thiscall
cfd::api::TransactionApi::CreateSignatureHash
          (string *__return_storage_ptr__,TransactionApi *this,string *tx_hex,TxInReference *txin,
          Script *redeem_script,Amount *amount,HashType hash_type,SigHashType *sighash_type)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_48;
  
  core::Script::GetData((ByteData *)&_Stack_48,redeem_script);
  CreateSignatureHash(__return_storage_ptr__,this,tx_hex,txin,(ByteData *)&_Stack_48,amount,
                      hash_type,sighash_type);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_48);
  return __return_storage_ptr__;
}

Assistant:

std::string TransactionApi::CreateSignatureHash(
    const std::string& tx_hex, const TxInReference& txin,
    const Script& redeem_script, const Amount& amount, HashType hash_type,
    const SigHashType& sighash_type) const {
  return CreateSignatureHash(
      tx_hex, txin, redeem_script.GetData(), amount, hash_type, sighash_type);
}